

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicFenceTests.cpp
# Opt level: O0

TestStatus *
vkt::synchronization::anon_unknown_0::basicMultiFenceCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deUint64 dVar1;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  VkResult VVar2;
  int iVar3;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue pVVar4;
  Handle<(vk::HandleType)24> *pHVar5;
  Handle<(vk::HandleType)6> *pHVar6;
  VkCommandBuffer_s **ppVVar7;
  VkAllocationCallbacks **local_380;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  deUint64 local_288;
  allocator<char> local_279;
  string local_278;
  VkCommandBufferInheritanceInfo *local_258;
  allocator<char> local_249;
  string local_248;
  undefined4 local_228;
  allocator<char> local_221;
  string local_220;
  VkCommandBufferInheritanceInfo *local_200;
  undefined8 uStack_1f8;
  VkSubmitInfo submitInfo;
  undefined8 uStack_1a8;
  VkCommandBufferBeginInfo info;
  VkFence fence [2];
  undefined1 local_168 [8];
  Move<vk::Handle<(vk::HandleType)6>_> ptrFence [2];
  VkFenceCreateInfo fenceInfo;
  Move<vk::VkCommandBuffer_s_*> local_108;
  RefData<vk::VkCommandBuffer_s_*> local_e8;
  undefined1 local_c8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  Move<vk::Handle<(vk::HandleType)24>_> local_98;
  RefData<vk::Handle<(vk::HandleType)24>_> local_78;
  undefined1 local_58 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  Context *context_local;
  
  vk_00 = Context::getDeviceInterface(context);
  device_00 = Context::getDevice(context);
  pVVar4 = Context::getUniversalQueue(context);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_ =
       Context::getUniversalQueueFamilyIndex(context);
  ::vk::createCommandPool
            (&local_98,vk_00,device_00,2,
             cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_
             ,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data.object.m_internal = local_78.object.m_internal;
  data.deleter.m_device = local_78.deleter.m_device;
  data.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_58,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_98);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_58);
  makeCommandBuffer(&local_108,vk_00,device_00,(VkCommandPool)pHVar5->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e8,(Move *)&local_108);
  data_00.deleter.m_deviceIface = local_e8.deleter.m_deviceIface;
  data_00.object = local_e8.object;
  data_00.deleter.m_device = local_e8.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_e8.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_c8,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_108);
  ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x8;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_168,vk_00,device_00,
                    (VkFenceCreateInfo *)
                    &ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                     m_allocator,(VkAllocationCallbacks *)0x0);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)
                    &ptrFence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                     m_allocator,vk_00,device_00,
                    (VkFenceCreateInfo *)
                    &ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                     m_allocator,(VkAllocationCallbacks *)0x0);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_168);
  info.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)pHVar6->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)
                      &ptrFence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                       m_allocator);
  dVar1 = pHVar6->m_internal;
  info.pNext = (void *)0x4;
  info.flags = 0;
  info._20_4_ = 0;
  uStack_1a8 = 0x2a;
  info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  info._4_4_ = 0;
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_1f8 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_c8);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_c8);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,*ppVVar7,&uStack_1a8);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*cmdBuffer, &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicFenceTests.cpp"
                    ,0x8a);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_c8);
  endCommandBuffer(vk_00,*ppVVar7);
  local_200 = info.pInheritanceInfo;
  VVar2 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar4,1,&uStack_1f8,info.pInheritanceInfo);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, fence[FISRT_FENCE])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicFenceTests.cpp"
                    ,0x8d);
  iVar3 = (*vk_00->_vptr_DeviceInterface[0x16])
                    (vk_00,device_00,1,&info.pInheritanceInfo,0,0xffffffffffffffff);
  if (iVar3 == 0) {
    iVar3 = (*vk_00->_vptr_DeviceInterface[0x14])(vk_00,device_00,1,&info.pInheritanceInfo);
    if (iVar3 == 0) {
      local_258 = info.pInheritanceInfo;
      VVar2 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar4,1,&uStack_1f8,info.pInheritanceInfo);
      ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, fence[FISRT_FENCE])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicFenceTests.cpp"
                        ,0x95);
      iVar3 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device_00,2,&info.pInheritanceInfo,1,1000)
      ;
      if (iVar3 == 2) {
        local_288 = dVar1;
        VVar2 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar4,1,&uStack_1f8,dVar1);
        ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, fence[SECOND_FENCE])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicFenceTests.cpp"
                          ,0x9a);
        iVar3 = (*vk_00->_vptr_DeviceInterface[0x16])
                          (vk_00,device_00,2,&info.pInheritanceInfo,1,0xffffffffffffffff);
        if (iVar3 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2d0,"Basic multi fence tests passed",&local_2d1);
          tcu::TestStatus::pass(__return_storage_ptr__,&local_2d0);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::allocator<char>::~allocator(&local_2d1);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,"vkWaitForFences should return VK_SUCCESS",&local_2a9);
          tcu::TestStatus::fail(__return_storage_ptr__,&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::allocator<char>::~allocator(&local_2a9);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_278,"vkWaitForFences should return VK_TIMEOUT",&local_279);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator(&local_279);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,"Couldn\'t reset the fence",&local_249);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"vkWaitForFences should return VK_SUCCESS",&local_221);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
  }
  local_228 = 1;
  local_380 = &ptrFence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator;
  do {
    local_380 = local_380 + -4;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)6>_> *)local_380);
  } while (local_380 != (VkAllocationCallbacks **)local_168);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus basicMultiFenceCase (Context& context)
{
	enum{FISRT_FENCE=0,SECOND_FENCE};
	const DeviceInterface&			vk					= context.getDeviceInterface();
	const VkDevice					device				= context.getDevice();
	const VkQueue					queue				= context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	const Unique<VkCommandPool>		cmdPool				(createCommandPool(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,  queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(makeCommandBuffer(vk, device, *cmdPool));
	const VkFenceCreateInfo			fenceInfo			=
														{
															VK_STRUCTURE_TYPE_FENCE_CREATE_INFO, // VkStructureType		sType;
															DE_NULL,							 // const void*			pNext;
															0u,									 // VkFenceCreateFlags	flags;
														};
	const Move<VkFence>				ptrFence[2]			= { createFence(vk, device, &fenceInfo), createFence(vk, device, &fenceInfo) };
	const VkFence					fence[2]			= { *ptrFence[FISRT_FENCE], *ptrFence[SECOND_FENCE] };
	const VkCommandBufferBeginInfo	info				=
														{
															VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType                          sType;
															DE_NULL,										// const void*                              pNext;
															VK_COMMAND_BUFFER_USAGE_SIMULTANEOUS_USE_BIT,	// VkCommandBufferUsageFlags                flags;
															DE_NULL,										// const VkCommandBufferInheritanceInfo*    pInheritanceInfo;
														};
	const VkSubmitInfo				submitInfo			=
														{
															VK_STRUCTURE_TYPE_SUBMIT_INFO,		// VkStructureType			sType;
															DE_NULL,							// const void*				pNext;
															0u,									// deUint32					waitSemaphoreCount;
															DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
															(const VkPipelineStageFlags*)DE_NULL,
															1u,									// deUint32					commandBufferCount;
															&cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
															0u,									// deUint32					signalSemaphoreCount;
															DE_NULL,							// const VkSemaphore*		pSignalSemaphores;
														};


	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &info));
	endCommandBuffer(vk, *cmdBuffer);

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, fence[FISRT_FENCE]));

	if (VK_SUCCESS != vk.waitForFences(device, 1u, &fence[FISRT_FENCE], DE_FALSE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("vkWaitForFences should return VK_SUCCESS");

	if (VK_SUCCESS != vk.resetFences(device, 1u, &fence[FISRT_FENCE]))
		return tcu::TestStatus::fail("Couldn't reset the fence");

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, fence[FISRT_FENCE]));

	if (VK_TIMEOUT != vk.waitForFences(device, 2u, &fence[FISRT_FENCE], DE_TRUE, SHORT_FENCE_WAIT))
		return tcu::TestStatus::fail("vkWaitForFences should return VK_TIMEOUT");

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, fence[SECOND_FENCE]));

	if (VK_SUCCESS != vk.waitForFences(device, 2u, &fence[FISRT_FENCE], DE_TRUE, LONG_FENCE_WAIT))
		return tcu::TestStatus::fail("vkWaitForFences should return VK_SUCCESS");

	return tcu::TestStatus::pass("Basic multi fence tests passed");
}